

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O0

void __thiscall
test_matrix_dense_matrix_vector_multiplication_Test::
~test_matrix_dense_matrix_vector_multiplication_Test
          (test_matrix_dense_matrix_vector_multiplication_Test *this)

{
  test_matrix_dense_matrix_vector_multiplication_Test *this_local;
  
  ~test_matrix_dense_matrix_vector_multiplication_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_dense, matrix_vector_multiplication) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 2, 2> static_matrix = {{10, 20}, {30, 40}};
  Vector_Dense<Scalar, 0> dynamic_vector = {-1, 2};
  Vector_Dense<Scalar, 2> static_vector = {-10, 20};

  Vector_Dense<Scalar, 0> result_dynamic = dynamic_matrix * dynamic_vector;
  Vector_Dense<Scalar, 2> result_static_0 = static_matrix * static_vector;
  EXPECT_DOUBLE_EQ(result_dynamic[0], 3);
  EXPECT_DOUBLE_EQ(result_dynamic[1], 5);
  EXPECT_DOUBLE_EQ(result_static_0[0], 300);
  EXPECT_DOUBLE_EQ(result_static_0[1], 500);

  result_static_0 = dynamic_matrix * static_vector;
  Vector_Dense<Scalar, 2> result_static_1 = static_matrix * dynamic_vector;
  EXPECT_DOUBLE_EQ(result_static_0[0], 30);
  EXPECT_DOUBLE_EQ(result_static_0[1], 50);
  EXPECT_DOUBLE_EQ(result_static_1[0], 30);
  EXPECT_DOUBLE_EQ(result_static_1[1], 50);

  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_incorrect;
  Matrix_Dense<Scalar, 3, 3> static_matrix_incorrect;
  Vector_Dense<Scalar, 0> dynamic_vector_incorrect;
  Vector_Dense<Scalar, 3> static_vector_incorrect;
  EXPECT_DEATH(dynamic_matrix_incorrect * dynamic_vector, "./*");
  EXPECT_DEATH(dynamic_matrix_incorrect * static_vector, "./*");
  EXPECT_DEATH(static_matrix_incorrect * dynamic_vector, "./*");
  EXPECT_DEATH(static_matrix_incorrect * static_vector, "./*");
  EXPECT_DEATH(dynamic_matrix * dynamic_vector_incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix * static_vector_incorrect, "./*");
  EXPECT_DEATH(static_matrix * dynamic_vector_incorrect, "./*");
  EXPECT_DEATH(static_matrix * static_vector_incorrect, "./*");
}